

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O3

_Bool cave_find_in_range(chunk_conflict *c,loc_conflict *grid,loc_conflict top_left,
                        loc_conflict bottom_right,square_predicate pred)

{
  _Bool _Var1;
  _Bool _Var2;
  int *state;
  
  state = cave_find_init(top_left,bottom_right);
  do {
    _Var1 = cave_find_get_grid(grid,state);
    if (!_Var1) break;
    _Var2 = (*pred)(c,*grid);
  } while (!_Var2);
  mem_free(state);
  return _Var1;
}

Assistant:

bool cave_find_in_range(struct chunk *c, struct loc *grid,
		struct loc top_left, struct loc bottom_right,
		square_predicate pred)
{
	int *state = cave_find_init(top_left, bottom_right);
	bool found = false;

	while (!found && cave_find_get_grid(grid, state)) {
		found = pred(c, *grid);
	}
	mem_free(state);
	return found;
}